

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mine.cpp
# Opt level: O3

void __thiscall Mine::Mine(Mine *this,string *n,int t,int spT)

{
  pointer pcVar1;
  string local_50;
  
  pcVar1 = (n->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,pcVar1,pcVar1 + n->_M_string_length)
  ;
  Holding::Holding(&this->super_Holding,&local_50,t,spT,5,3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  (this->super_Holding).super_BlackCard.super_Card._vptr_Card =
       (_func_int **)&PTR_effectBonus_00118b18;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->name);
  this->cost = 5;
  this->tapped = false;
  this->revealed = false;
  this->harvestValue = 3;
  this->upperHolding = (Holding *)0x0;
  this->subHolding = (Holding *)0x0;
  return;
}

Assistant:

Mine::Mine(string n, int t, int spT) : Holding{n, t, spT, 5, 3}
{
    name = n;
    cost = 5;
    tapped = false;
    revealed = false;
    harvestValue = 3;

    upperHolding = nullptr;
    subHolding = nullptr;
}